

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

int __thiscall libchars::editor::print(editor *this)

{
  size_t *psVar1;
  double dVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  terminal_driver *ptVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  debug *pdVar9;
  terminal_driver *ptVar10;
  auto_cursor aVar11;
  undefined4 extraout_var_06;
  edit_object *peVar12;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  long lVar13;
  ulong uVar14;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  terminal_driver *ptVar15;
  size_t in_RCX;
  size_t __n;
  void *pvVar16;
  ulong uVar17;
  ulong uVar18;
  terminal_driver *ptVar19;
  size_t sVar20;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  size_t local_70;
  size_t y;
  terminal_driver *local_60;
  auto_cursor local_58;
  auto_cursor __;
  terminal_driver *local_48;
  terminal_driver *ptVar8;
  undefined4 extraout_var_05;
  
  this->state = IDLE;
  peVar12 = this->obj;
  if (peVar12->mode == MODE_MULTILINE) {
    if (peVar12->prompt_rendered == 0) {
      terminal_driver::write
                (this->driver,(int)(peVar12->prompt)._M_dataplus._M_p,
                 (void *)(peVar12->prompt)._M_string_length,in_RCX);
      peVar12 = this->obj;
      peVar12->prompt_rendered = (peVar12->prompt)._M_string_length;
    }
    uVar17 = peVar12->cursor;
    pvVar16 = (void *)(peVar12->insert_idx - uVar17);
    if (peVar12->insert_idx < uVar17 || pvVar16 == (void *)0x0) {
      return 0;
    }
    terminal_driver::write(this->driver,(int)peVar12 + (int)uVar17 + 8,pvVar16,uVar17);
    this->obj->cursor = this->obj->insert_idx;
    return 0;
  }
  ptVar7 = this->driver;
  if (ptVar7->control_enabled == false) {
    if (peVar12->prompt_rendered == 0) {
      terminal_driver::write
                (ptVar7,(int)(peVar12->prompt)._M_dataplus._M_p,
                 (void *)(peVar12->prompt)._M_string_length,in_RCX);
      peVar12 = this->obj;
      peVar12->prompt_rendered = (peVar12->prompt)._M_string_length;
    }
    uVar17 = peVar12->cursor;
    if (peVar12->insert_idx <= uVar17) {
      return 0;
    }
    if (peVar12->buflen < uVar17) {
      uVar17 = peVar12->buflen;
    }
    iVar4 = (*peVar12->_vptr_edit_object[0xc])(peVar12,uVar17);
    peVar12 = this->obj;
    uVar17 = peVar12->insert_idx + 1;
    if (peVar12->buflen < uVar17) {
      uVar17 = peVar12->buflen;
    }
    iVar5 = (*peVar12->_vptr_edit_object[0xc])(peVar12,uVar17);
    sVar20 = CONCAT44(extraout_var_00,iVar5) - CONCAT44(extraout_var,iVar4);
    if (this->obj->mode == MODE_PASSWORD) {
      sVar20 = 0;
    }
    if (CONCAT44(extraout_var_00,iVar5) <= CONCAT44(extraout_var,iVar4)) {
      sVar20 = 0;
    }
    sVar20 = render(this,this->obj->cursor,sVar20);
    psVar1 = &this->obj->cursor;
    *psVar1 = *psVar1 + sVar20;
    return 0;
  }
  local_60 = (terminal_driver *)ptVar7->t_cols;
  uVar17 = ptVar7->t_rows;
  if (uVar17 == 0 || local_60 == (terminal_driver *)0x0) {
    return -2;
  }
  if ((uVar17 | (ulong)local_60) < 2) {
    return -3;
  }
  ptVar7 = (terminal_driver *)(uVar17 * (long)local_60 - 1);
  uVar17 = peVar12->insert_idx;
  if (peVar12->buflen < peVar12->insert_idx) {
    uVar17 = peVar12->buflen;
  }
  iVar4 = (*peVar12->_vptr_edit_object[0xd])(peVar12,uVar17);
  ptVar8 = (terminal_driver *)CONCAT44(extraout_var_01,iVar4);
  peVar12 = this->obj;
  uVar17 = peVar12->insert_idx;
  if (peVar12->buflen < peVar12->insert_idx) {
    uVar17 = peVar12->buflen;
  }
  iVar4 = (*peVar12->_vptr_edit_object[0xc])(peVar12,uVar17);
  peVar12 = this->obj;
  uVar17 = peVar12->insert_idx + 1;
  if (peVar12->buflen < uVar17) {
    uVar17 = peVar12->buflen;
  }
  iVar5 = (*peVar12->_vptr_edit_object[0xc])(peVar12,uVar17);
  peVar12 = this->obj;
  if (peVar12->mode == MODE_PASSWORD) {
    local_48 = (terminal_driver *)0x0;
  }
  else {
    iVar6 = (*peVar12->_vptr_edit_object[0xc])(peVar12,peVar12->buflen);
    local_48 = (terminal_driver *)CONCAT44(extraout_var_04,iVar6);
  }
  __.driver = (terminal_driver *)CONCAT44(extraout_var_02,iVar4);
  if (ptVar8 < (terminal_driver *)CONCAT44(extraout_var_02,iVar4)) {
    __.driver = ptVar8;
  }
  y = (size_t)CONCAT44(extraout_var_03,iVar5);
  if ((terminal_driver *)CONCAT44(extraout_var_03,iVar5) <= __.driver) {
    y = (size_t)__.driver;
  }
  if (ptVar7 < (long)ptVar8 - __.driver) {
    ptVar8 = __.driver;
  }
  pdVar9 = debug::initialize(0);
  aVar11.driver = __.driver;
  debug::log(pdVar9,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  peVar12 = this->obj;
  if (ptVar7 < (terminal_driver *)
               ((local_48->original_termios).c_cc + ((peVar12->prompt)._M_string_length - 0x11))) {
    if (local_48 == (terminal_driver *)0x0) {
      ptVar19 = (terminal_driver *)0x0;
      local_48 = (terminal_driver *)0x0;
      __.driver = (terminal_driver *)0x0;
    }
    else {
      if (y - aVar11.driver < ptVar7) {
        ptVar10 = (terminal_driver *)((ulong)ptVar7 >> 1);
        ptVar19 = (terminal_driver *)0x0;
        if (ptVar10 < (terminal_driver *)((long)local_48 - (long)ptVar8)) {
          if (ptVar10 <= ptVar8) {
            ptVar19 = (terminal_driver *)((long)ptVar8 - (long)ptVar10);
          }
        }
        else if (ptVar7 <= local_48) {
          ptVar19 = (terminal_driver *)((long)local_48 - (long)ptVar7);
        }
        pdVar9 = debug::initialize(0);
        dVar2 = debug::log(pdVar9,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
        uVar17 = (long)aVar11.driver - (long)ptVar19;
        if (aVar11.driver < ptVar19 || uVar17 == 0) {
          peVar12 = this->obj;
          goto LAB_00114710;
        }
        peVar12 = this->obj;
        sVar20 = 0;
        if (uVar17 <= peVar12->insert_idx) {
          sVar20 = peVar12->insert_idx - uVar17;
        }
        uVar17 = peVar12->buflen;
        if (sVar20 <= peVar12->buflen) {
          uVar17 = sVar20;
        }
        iVar4 = (*peVar12->_vptr_edit_object[0xc])(SUB84(dVar2,0),peVar12,uVar17);
        aVar11.driver = (terminal_driver *)CONCAT44(extraout_var_05,iVar4);
        if (ptVar19 < aVar11.driver) {
          while ((sVar20 != 0 && (ptVar19 < aVar11.driver))) {
            sVar20 = sVar20 - 1;
            peVar12 = this->obj;
            uVar17 = peVar12->buflen;
            if (sVar20 <= peVar12->buflen) {
              uVar17 = sVar20;
            }
            iVar4 = (*peVar12->_vptr_edit_object[0xc])(peVar12,uVar17);
            aVar11.driver = (terminal_driver *)CONCAT44(extraout_var_06,iVar4);
          }
          if (aVar11.driver < ptVar19) {
            sVar20 = sVar20 + 1;
            peVar12 = this->obj;
            uVar17 = peVar12->buflen;
            if (sVar20 <= peVar12->buflen) {
              uVar17 = sVar20;
            }
            iVar4 = (*peVar12->_vptr_edit_object[0xc])(peVar12,uVar17);
            aVar11.driver = (terminal_driver *)CONCAT44(extraout_var_08,iVar4);
          }
        }
        else if (aVar11.driver < ptVar19) {
          while ((aVar11.driver < ptVar19 && (peVar12 = this->obj, sVar20 < peVar12->insert_idx))) {
            sVar20 = sVar20 + 1;
            uVar17 = peVar12->buflen;
            if (sVar20 <= peVar12->buflen) {
              uVar17 = sVar20;
            }
            iVar4 = (*peVar12->_vptr_edit_object[0xc])(peVar12,uVar17);
            aVar11.driver = (terminal_driver *)CONCAT44(extraout_var_07,iVar4);
          }
        }
      }
      else {
LAB_00114710:
        sVar20 = peVar12->insert_idx;
      }
      pdVar9 = debug::initialize(0);
      dVar2 = debug::log(pdVar9,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
      local_60 = (terminal_driver *)
                 ((ptVar7->original_termios).c_cc +
                 (long)(((aVar11.driver)->original_termios).c_cc + -0x22));
      if (local_60 < local_48) {
        local_48 = local_60;
      }
      peVar12 = this->obj;
      uVar17 = peVar12->insert_idx;
      if (peVar12->insert_idx <= sVar20) {
        uVar17 = sVar20;
      }
      uVar14 = uVar17 + 1;
      if (peVar12->buflen < uVar17 + 1) {
        uVar14 = peVar12->buflen;
      }
      __.driver = aVar11.driver;
      iVar4 = (*peVar12->_vptr_edit_object[0xc])(SUB84(dVar2,0),peVar12,uVar14);
      ptVar10 = (terminal_driver *)CONCAT44(extraout_var_09,iVar4);
      pdVar9 = debug::initialize(0);
      sVar3 = y;
      dVar2 = debug::log(pdVar9,(double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
      lVar13 = (long)local_48 - sVar3;
      if (sVar3 <= local_48 && lVar13 != 0) {
        peVar12 = this->obj;
        uVar14 = lVar13 + peVar12->insert_idx;
        uVar17 = peVar12->buflen;
        if (uVar17 < uVar14) {
          uVar14 = uVar17;
        }
        uVar18 = uVar14 + 1;
        if (uVar17 < uVar14 + 1) {
          uVar18 = uVar17;
        }
        iVar4 = (*peVar12->_vptr_edit_object[0xc])(SUB84(dVar2,0),peVar12,uVar18);
        ptVar10 = (terminal_driver *)CONCAT44(extraout_var_10,iVar4);
        if (ptVar10 < local_48) {
          while( true ) {
            peVar12 = this->obj;
            uVar17 = peVar12->buflen;
            if ((local_48 <= ptVar10) || (uVar17 <= uVar14)) break;
            uVar18 = uVar14 + 2;
            if (uVar17 < uVar14 + 2) {
              uVar18 = uVar17;
            }
            iVar4 = (*peVar12->_vptr_edit_object[0xc])(peVar12,uVar18);
            ptVar10 = (terminal_driver *)CONCAT44(extraout_var_11,iVar4);
            uVar14 = uVar14 + 1;
          }
          if ((local_48 < ptVar10) && (peVar12->insert_idx < uVar14)) {
            if (uVar17 < uVar14) {
              uVar14 = uVar17;
            }
            iVar4 = (*peVar12->_vptr_edit_object[0xc])(peVar12,uVar14);
            ptVar10 = (terminal_driver *)CONCAT44(extraout_var_13,iVar4);
          }
        }
        else if (local_48 < ptVar10) {
          while ((local_48 < ptVar10 && (peVar12 = this->obj, peVar12->insert_idx < uVar14))) {
            uVar17 = uVar14;
            if (peVar12->buflen < uVar14) {
              uVar17 = peVar12->buflen;
            }
            iVar4 = (*peVar12->_vptr_edit_object[0xc])(peVar12,uVar17);
            ptVar10 = (terminal_driver *)CONCAT44(extraout_var_12,iVar4);
            uVar14 = uVar14 - 1;
          }
        }
      }
      ptVar15 = local_60;
      if ((long)ptVar10 - __.driver <= ptVar7) {
        ptVar15 = ptVar10;
      }
      ptVar19 = (terminal_driver *)0x0;
      if (__.driver <= ptVar10) {
        ptVar19 = (long)ptVar15 - __.driver;
      }
      pdVar9 = debug::initialize(0);
      debug::log(pdVar9,(double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
      local_48 = (terminal_driver *)sVar20;
    }
    local_58.driver = this->driver;
    terminal_driver::cursor_disable(local_58.driver);
    terminal_driver::clear_screen(this->driver);
    pvVar16 = (void *)((long)ptVar7 - (long)ptVar19);
    if (ptVar7 < ptVar19 || pvVar16 == (void *)0x0) {
      this->obj->prompt_rendered = 0;
    }
    else {
      peVar12 = this->obj;
      peVar12->prompt_rendered = (size_t)pvVar16;
      terminal_driver::write
                (this->driver,
                 ((int)(peVar12->prompt)._M_dataplus._M_p + (int)(peVar12->prompt)._M_string_length)
                 - (int)pvVar16,pvVar16,(size_t)ptVar7);
      pdVar9 = debug::initialize(0);
      debug::log(pdVar9,(double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
      ptVar7 = ptVar19;
    }
    sVar20 = render(this,(size_t)local_48,(size_t)ptVar7);
    pdVar9 = debug::initialize(0);
    debug::log(pdVar9,(double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
    iVar4 = terminal_driver::set_new_xy
                      (this->driver,
                       (long)ptVar8 - (long)(((__.driver)->original_termios).c_cc + (sVar20 - 0x11))
                      );
    terminal_driver::auto_cursor::~auto_cursor(&local_58);
    if (iVar4 < 0) {
      return -1;
    }
    if (ptVar7 != (terminal_driver *)0x0) goto LAB_00114a9c;
  }
  else {
    pdVar9 = debug::initialize(0);
    debug::log(pdVar9,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    __n = 0x1144b8;
    iVar4 = terminal_driver::set_new_xy
                      (this->driver,-(this->obj->cursor + this->obj->prompt_rendered));
    if (iVar4 < 0) {
      return -1;
    }
    terminal_driver::clear_to_end_of_screen(this->driver);
    peVar12 = this->obj;
    pvVar16 = (void *)(peVar12->prompt)._M_string_length;
    if (pvVar16 == (void *)0x0) {
      sVar20 = 0;
    }
    else {
      terminal_driver::write(this->driver,(int)(peVar12->prompt)._M_dataplus._M_p,pvVar16,__n);
      pdVar9 = debug::initialize(0);
      debug::log(pdVar9,(double)this->obj->cursor);
      peVar12 = this->obj;
      peVar12->cursor = 0;
      sVar20 = (peVar12->prompt)._M_string_length;
    }
    peVar12->prompt_rendered = sVar20;
    if (local_48 != (terminal_driver *)0x0) {
      local_58.driver = this->driver;
      terminal_driver::cursor_disable(local_58.driver);
      sVar20 = render(this,0,(size_t)local_48);
      pdVar9 = debug::initialize(0);
      debug::log(pdVar9,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      if ((this->obj->prompt_rendered + sVar20) % (ulong)local_60 == 0) {
        terminal_driver::newline(this->driver);
      }
      iVar4 = terminal_driver::set_new_xy(this->driver,(long)ptVar8 - sVar20);
      terminal_driver::auto_cursor::~auto_cursor(&local_58);
      if (iVar4 < 0) {
        return -1;
      }
      goto LAB_00114a9c;
    }
  }
  ptVar8 = (terminal_driver *)0x0;
LAB_00114a9c:
  this->obj->cursor = (size_t)ptVar8;
  pdVar9 = debug::initialize(0);
  if ((3 < pdVar9->log_level) && (this->driver->control_enabled == true)) {
    terminal_driver::cursor_position(this->driver,(size_t *)&local_58,&local_70,-1);
    pdVar9 = debug::initialize(0);
    debug::log(pdVar9,(double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08));
  }
  return 0;
}

Assistant:

int editor::print()
    {
        state = IDLE;

        if (obj->mode == MODE_MULTILINE) {
            // render prompt (if not already rendered)
            if (obj->prompt_rendered == 0) {
                driver.write(obj->prompt.data(), obj->prompt.length());
                obj->prompt_rendered = obj->prompt.length();
            }
            // print from previous cursor up to current end-of-buffer
            if (obj->cursor < obj->insert_idx) {
                size_t n_to_write = (obj->insert_idx - obj->cursor);
                driver.write(obj->data() + obj->cursor, n_to_write);
                obj->cursor = obj->insert_idx;
            }
        }
        else if (!driver.control()) {
            // render prompt (if not already rendered)
            if (obj->prompt_rendered == 0) {
                driver.write(obj->prompt.data(), obj->prompt.length());
                obj->prompt_rendered = obj->prompt.length();
            }
            // render from previous position up to current end-of-buffer
            if (obj->cursor < obj->insert_idx) {
                size_t start = obj->terminal_idx(obj->idx(obj->cursor));
                size_t end = obj->terminal_idx(obj->idx(obj->insert_idx + 1));
                size_t render_length = (obj->mode == MODE_PASSWORD || end <= start) ? 0 : (end - start);
                obj->cursor += render(obj->cursor,render_length);
            }
        } 
        else {
          size_t cols = driver.columns();
          size_t rows = driver.rows();

          // invalid: no rows or columns
          if (cols == 0 || rows == 0)
              return -2;
          // do nothing if only 1 position available (1 x 1 terminal)
          if (cols <= 1 && rows <= 1)
              return -3;

          // calculate available terminal space (leave extra space at the end for the cursor to overflow into)
          size_t window = cols * rows - 1;

          // dump will be limited depending on available terminal space;
          // prompt will be shortened if terminal not big enough for full string

          size_t cursor = obj->terminal_cursor(obj->idx(obj->insert_idx));
          size_t start = obj->terminal_idx(obj->idx(obj->insert_idx));
          size_t end = obj->terminal_idx(obj->idx(obj->insert_idx + 1));

          size_t render_length = (obj->mode == MODE_PASSWORD) ? 0 : obj->terminal_idx(obj->idx(obj->length()));

          if (cursor < start)
              start = cursor;
          if (end < start)
              end = start;
          if ((cursor - start) > window)
              cursor = start;

          LC_LOG_VERBOSE("window[%zu:%zux%zu];start[%zu];cursor[%zu];end[%zu];render_len[%zu]",window,cols,rows,start,cursor,end,render_length);

          if ((render_length + obj->prompt.length()) > window) {
              size_t idx_from = 0;
              size_t from = 0;
              if (render_length > 0) {
                  if ((end - start) >= window) {
                      idx_from = obj->insert_idx;
                      from = start;
                  }
                  else {
                      size_t search_from = 0;
                      if ((render_length - cursor) <= window/2) { // <-- cursor in last 1/2 window
                          // find all complete expanded characters that fit into (window - (LENGTH - START)) before START
                          if (render_length > window)
                              search_from = render_length - window;
                          else
                              search_from = 0;
                      }
                      else if (cursor < window/2) { // <-- cursor in first 1/2 window
                          // find all complete expanded characters that fit into space before START
                          search_from = 0;
                      }
                      else {
                          search_from = cursor - window/2;
                      }
                      LC_LOG_VERBOSE("search_from[%zu];start[%zu]",search_from,start);

                      if (search_from < start) {
                          // start searching with assumption that render is 1:1 with buffer
                          size_t space = start - search_from;
                          if (space < obj->insert_idx)
                              idx_from = obj->insert_idx - space;
                          else
                              idx_from = 0;
                          // keep on comparing until rendered string fits in or until space runs out
                          from = obj->terminal_idx(obj->idx(idx_from));
                          if (from > search_from) {
                              // more space available; search backwards
                              while (idx_from > 0 && from > search_from) {
                                  --idx_from;
                                  from = obj->terminal_idx(obj->idx(idx_from));
                              }
                              if (from < search_from) {
                                  ++idx_from;
                                  from = obj->terminal_idx(obj->idx(idx_from));
                              }
                          }
                          else if (from < search_from) {
                              // used too much space; search forwards
                              while (idx_from < obj->insert_idx && from < search_from) {
                                  ++idx_from;
                                  from = obj->terminal_idx(obj->idx(idx_from));
                              }
                          }
                      }
                      else {
                          idx_from = obj->insert_idx;
                          from = start;
                      }
                  }

                  LC_LOG_VERBOSE("from[%zu];idx_from[%zu]",from,idx_from);

                  // find all expanded characters (even partial) that fit into (window - END) on and after END
                  size_t search_to = from + window;
                  if (search_to > render_length)
                      search_to = render_length;
                  size_t idx_to = obj->insert_idx;
                  if (idx_to < idx_from)
                      idx_to = idx_from;
                  size_t to = obj->terminal_idx(obj->idx(idx_to + 1));

                  LC_LOG_VERBOSE("search_to[%zu];end[%zu]",search_to,end);

                  if (search_to > end) {
                      // start searching with assumption that render is 1:1 with buffer
                      idx_to = obj->idx(obj->insert_idx + (search_to - end));
                      // keep on comparing until rendered string fits in or until space runs out
                      to = obj->terminal_idx(obj->idx(idx_to + 1));
                      if (to < search_to) {
                          // more space available; search forwards
                          while (idx_to < obj->length() && to < search_to) {
                              ++idx_to;
                              to = obj->terminal_idx(obj->idx(idx_to + 1));
                          }
                          if (to > search_to && idx_to > obj->insert_idx) {
                              --idx_to;
                              to = obj->terminal_idx(obj->idx(idx_to + 1));
                          }
                      }
                      else if (to > search_to) {
                          // used too much space; search backwards
                          while (idx_to > obj->insert_idx && to > search_to) {
                              --idx_to;
                              to = obj->terminal_idx(obj->idx(idx_to + 1));
                          }
                      }
                  }

                  LC_LOG_VERBOSE("to[%zu];idx_to[%zu]",to,idx_to);

                  if (to < from)
                      to = from;
                  else if ((to - from) > window)
                      to = from + window;

                  render_length = to - from;
              }

              // start printing in upper-left corner
              terminal_driver::auto_cursor __(driver);
              driver.clear_screen();

              // print partial prompt (if possible)
              if (render_length < window) {
                  obj->prompt_rendered = window - render_length;
                  driver.write(obj->prompt.data() + obj->prompt.length() - obj->prompt_rendered, obj->prompt_rendered);
                  LC_LOG_VERBOSE("prompt_rendered[%zu]:%s",obj->prompt_rendered,obj->prompt.c_str()+obj->prompt.length()-obj->prompt_rendered);
              }
              else {
                  obj->prompt_rendered = 0;
                  render_length = window;
              }

              // print line[idx_from..]
              size_t rendered = render(idx_from, render_length);
              // move to final cursor position (relative to current position)
              LC_LOG_VERBOSE("cursor[%zu];from[%zu];rendered[%zu]",cursor,from,rendered);
              if (driver.set_new_xy((ssize_t)cursor - (ssize_t)(from + rendered)) < 0)
                  return -1;
          }
          else {
              LC_LOG_VERBOSE("obj->cursor[%zu]",obj->cursor);

              // move cursor to start of prompt position (relative to current position)
              if (driver.set_new_xy(0 - (ssize_t)obj->cursor - (ssize_t)obj->prompt_rendered) < 0)
                  return -1;

              // clear area for printing (TODO: optimize by only clearing specific lines)
              driver.clear_to_end_of_screen();

              // render prompt
              if (obj->prompt.length() > 0) {
                  driver.write(obj->prompt.data(), obj->prompt.length());
                  LC_LOG_VERBOSE("cursor[%zu];prompt_rendered[%zu]",obj->cursor,obj->prompt_rendered);
                  obj->cursor = 0;
              }
              obj->prompt_rendered = obj->prompt.length();

              if (render_length > 0) {
                  // print line
                  terminal_driver::auto_cursor __(driver);
                  size_t rendered = render(0, render_length);
                  LC_LOG_VERBOSE("rendered[%zu]",rendered);

                  // hack to convince cursor to move to the start of the next line
                  // on a fully populated rendered line
                  if (((obj->prompt_rendered + rendered) % cols) == 0)
                      driver.newline();

                  // move to final cursor position (relative to current position)
                  if (driver.set_new_xy((ssize_t)cursor - (ssize_t)rendered) < 0)
                      return -1;
              }
          }

          obj->cursor = (render_length > 0) ? cursor : 0;

          if (LC_LOG_CHECK_LEVEL(debug::VERBOSE) && driver.control()) {
              size_t x,y;
              driver.cursor_position(x,y);
              LC_LOG_VERBOSE("obj->cursor[%zu];x[%zu],y[%zu]",obj->cursor,x,y);
          }
        }

        return 0;
    }